

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long mkvparser::UnserializeInt(IMkvReader *pReader,longlong pos,longlong size,longlong *result_ref)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uchar b;
  char first_byte;
  undefined8 uStack_38;
  
  lVar2 = -2;
  if (0xfffffffffffffff7 < size - 9U && (-1 < pos && pReader != (IMkvReader *)0x0)) {
    uStack_38 = in_RAX & 0xffffffffffffff;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
    if (iVar1 < 0) {
LAB_0010ebce:
      lVar2 = (long)iVar1;
    }
    else {
      uVar3 = (ulong)uStack_38._7_1_;
      if (1 < (ulong)size) {
        lVar4 = pos + 1;
        lVar2 = size + -1;
        do {
          iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,(long)&uStack_38 + 6);
          if (iVar1 < 0) goto LAB_0010ebce;
          uVar3 = uVar3 << 8 | uStack_38 >> 0x30 & 0xff;
          lVar4 = lVar4 + 1;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      *result_ref = uVar3;
      lVar2 = 0;
    }
  }
  return lVar2;
}

Assistant:

long UnserializeInt(IMkvReader* pReader, long long pos, long long size,
                    long long& result_ref) {
  if (!pReader || pos < 0 || size < 1 || size > 8)
    return E_FILE_FORMAT_INVALID;

  signed char first_byte = 0;
  const long status = pReader->Read(pos, 1, (unsigned char*)&first_byte);

  if (status < 0)
    return status;

  unsigned long long result = static_cast<unsigned long long>(first_byte);
  ++pos;

  for (long i = 1; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  result_ref = static_cast<long long>(result);
  return 0;
}